

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O0

size_t vbytefse::encode(uint32_t *in_ptr,size_t in_size_u32,uint8_t *out_ptr,size_t out_size_u8,
                       uint8_t *buf)

{
  size_t dstCapacity;
  size_t in_RCX;
  uint32_t *in_RDX;
  uint8_t *in_R8;
  size_t stored_bytes;
  uint32_t *out_ptr_u32;
  size_t vbyte_bytes;
  size_t in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  uint32_t *puVar1;
  size_t local_8;
  
  dstCapacity = vbyte::encode(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8,
                              in_stack_ffffffffffffffc0);
  *in_RDX = (uint32_t)dstCapacity;
  puVar1 = in_RDX;
  local_8 = FSE_compress(in_R8,dstCapacity,in_RDX,in_stack_ffffffffffffffb8);
  if (local_8 == 0) {
    *in_RDX = 0;
    memcpy(puVar1 + 1,in_R8,dstCapacity);
    local_8 = dstCapacity;
  }
  local_8 = local_8 + 4;
  return local_8;
}

Assistant:

static size_t encode(const uint32_t* in_ptr, size_t in_size_u32,
        uint8_t* out_ptr, size_t out_size_u8, uint8_t* buf = NULL)
    {
        size_t vbyte_bytes
            = vbyte::encode(in_ptr, in_size_u32, buf, out_size_u8);
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_ptr);
        *out_ptr_u32 = vbyte_bytes;
        auto stored_bytes = FSE_compress(out_ptr + sizeof(uint32_t),
            out_size_u8 - sizeof(uint32_t), buf, vbyte_bytes);
        if (stored_bytes == 0) {
            *out_ptr_u32 = 0;
            memcpy(out_ptr + sizeof(uint32_t), buf, vbyte_bytes);
            return vbyte_bytes + sizeof(uint32_t);
        } else {
            return stored_bytes + sizeof(uint32_t);
        }
    }